

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_locale.cpp
# Opt level: O1

bool ON_Locale::ParseName
               (char *locale_name,int locale_name_element_count,char *language_code,
               size_t language_code_capacity,char *extlang_code,size_t extlang_code_capacity,
               char *script_code,size_t script_code_capacity,char *region_code,
               size_t region_code_capacity,char *sortorder,size_t sortorder_capacity)

{
  byte *pbVar1;
  char cVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  byte *pbVar10;
  byte *pbVar11;
  char *pcVar12;
  byte *pbVar13;
  char *pcVar14;
  long lVar15;
  ulong uVar16;
  bool bVar17;
  bool bVar18;
  long lVar19;
  ulong uVar20;
  char cVar21;
  byte bVar22;
  ulong uVar23;
  char *pcVar24;
  uint uVar25;
  byte bVar26;
  byte *pbVar27;
  ulong local_90;
  char *local_88;
  
  local_88 = (char *)0x0;
  local_90 = 0;
  if (language_code_capacity != 0 && language_code != (char *)0x0) {
    memset(language_code,0,language_code_capacity);
    local_90 = language_code_capacity;
    local_88 = language_code;
  }
  uVar7 = 0;
  pcVar12 = (char *)0x0;
  if (extlang_code_capacity != 0 && extlang_code != (char *)0x0) {
    memset(extlang_code,0,extlang_code_capacity);
    uVar7 = extlang_code_capacity;
    pcVar12 = extlang_code;
  }
  uVar8 = 0;
  pbVar13 = (byte *)0x0;
  if (script_code_capacity != 0 && script_code != (char *)0x0) {
    memset(script_code,0,script_code_capacity);
    uVar8 = script_code_capacity;
    pbVar13 = (byte *)script_code;
  }
  uVar9 = 0;
  pcVar14 = (char *)0x0;
  if (region_code_capacity != 0 && region_code != (char *)0x0) {
    memset(region_code,0,region_code_capacity);
    uVar9 = region_code_capacity;
    pcVar14 = region_code;
  }
  uVar23 = 0;
  pcVar24 = (char *)0x0;
  if (sortorder_capacity != 0 && sortorder != (char *)0x0) {
    memset(sortorder,0,sortorder_capacity);
    uVar23 = sortorder_capacity;
    pcVar24 = sortorder;
  }
  bVar26 = 0;
  if ((((sortorder != (char *)0x0 || sortorder_capacity == 0) &&
       ((region_code_capacity == 0 || region_code != (char *)0x0) &&
        ((script_code_capacity == 0 || script_code != (char *)0x0) &&
        ((extlang_code_capacity == 0 || extlang_code != (char *)0x0) &&
        (language_code_capacity == 0 || language_code != (char *)0x0))))) &&
      (bVar26 = 1, locale_name != (char *)0x0)) &&
     ((locale_name_element_count != 0 && (*locale_name != '\0')))) {
    if (locale_name_element_count < 0) {
      locale_name_element_count = ON_String::Length(locale_name);
    }
    if (1 < locale_name_element_count) {
      pbVar10 = (byte *)(locale_name + -1);
      lVar15 = -1;
      do {
        pbVar27 = pbVar10 + 1;
        pbVar10 = pbVar10 + 1;
        lVar15 = lVar15 + 1;
      } while ((byte)((*pbVar27 & 0xdf) + 0xbf) < 0x1a);
      if (1 < lVar15) {
        uVar16 = (ulong)(local_90 == 0);
        if (locale_name < pbVar10 && local_90 != 0) {
          uVar16 = 1;
          do {
            cVar2 = locale_name[uVar16 - 1];
            cVar21 = cVar2 + ' ';
            if (0x19 < (byte)(cVar2 + 0xbfU)) {
              cVar21 = cVar2;
            }
            local_88[uVar16 - 1] = cVar21;
          } while ((uVar16 < local_90) &&
                  (pbVar27 = (byte *)(locale_name + uVar16), uVar16 = uVar16 + 1, pbVar27 < pbVar10)
                  );
        }
        if ((*local_88 != '\0') && (local_88[1] != '\0')) {
          pbVar27 = (byte *)(locale_name + (uint)locale_name_element_count);
          if (pbVar10 < pbVar27) {
            bVar5 = true;
            uVar25 = 0;
            bVar4 = true;
            bVar17 = true;
            bVar18 = true;
            do {
              bVar26 = *pbVar10;
              if (bVar26 == 0) {
                bVar3 = false;
                uVar16 = 1;
              }
              else {
                if ((bVar26 == 0x5f) || (pbVar11 = pbVar10, bVar26 == 0x2d)) {
                  pbVar1 = pbVar10 + 1;
                  lVar19 = 1;
                  lVar15 = lVar19;
                  if (pbVar1 < pbVar27) {
                    do {
                      if (((pbVar10[lVar19] & 0xfe) != 0x30) &&
                         (lVar15 = lVar19, 0x19 < (byte)((pbVar10[lVar19] & 0xdf) + 0xbf))) break;
                      lVar6 = lVar19 + 1;
                      lVar19 = lVar19 + 1;
                      lVar15 = (long)pbVar27 - (long)pbVar10;
                    } while (pbVar10 + lVar6 < pbVar27);
                  }
                  pbVar11 = pbVar10 + lVar15;
                  if (2 < lVar15) {
                    uVar20 = lVar15 - 1;
                    if (((bVar17) && (bVar17 = false, bVar26 == 0x2d)) && (uVar20 == 3)) {
                      if (((0x19 < (byte)((*pbVar1 & 0xdf) + 0xbf)) ||
                          (0x19 < (byte)((pbVar10[2] & 0xdf) + 0xbf))) ||
                         (0x19 < (byte)((pbVar10[3] & 0xdf) + 0xbf))) {
                        bVar17 = false;
                        goto LAB_004d2ede;
                      }
                      if (uVar7 - 1 < 2) {
                        bVar17 = false;
                        goto LAB_004d308b;
                      }
                      if (uVar7 == 0) {
                        bVar17 = false;
                      }
                      else {
                        uVar20 = 1;
                        do {
                          bVar26 = pbVar10[uVar20];
                          bVar22 = bVar26 + 0x20;
                          if (0x19 < (byte)(bVar26 + 0xbf)) {
                            bVar22 = bVar26;
                          }
                          pcVar12[uVar20 - 1] = bVar22;
                          bVar17 = false;
                        } while ((uVar20 < uVar7) &&
                                (lVar15 = uVar20 + 1, uVar20 = uVar20 + 1,
                                pbVar10 + lVar15 < pbVar11));
                      }
LAB_004d30e3:
                      bVar3 = true;
                      pbVar10 = pbVar11;
                      goto LAB_004d308d;
                    }
LAB_004d2ede:
                    if ((bVar18) && ((bVar18 = false, bVar26 == 0x2d && (uVar20 == 4)))) {
                      bVar22 = *pbVar1;
                      if (((byte)((bVar22 & 0xdf) + 0xbf) < 0x1a) &&
                         ((((byte)((pbVar10[2] & 0xdf) + 0xbf) < 0x1a &&
                           ((byte)((pbVar10[3] & 0xdf) + 0xbf) < 0x1a)) &&
                          ((byte)((pbVar10[4] & 0xdf) + 0xbf) < 0x1a)))) {
                        if (uVar8 - 1 < 3) {
                          bVar18 = false;
                          goto LAB_004d308b;
                        }
                        if (uVar8 != 0) {
                          bVar26 = bVar22 - 0x20;
                          if (0x19 < (byte)(bVar22 + 0x9f)) {
                            bVar26 = bVar22;
                          }
                          *pbVar13 = bVar26;
                          if (1 < uVar8) {
                            lVar15 = 3;
                            do {
                              bVar26 = pbVar10[lVar15 + -1];
                              bVar22 = bVar26 + 0x20;
                              if (0x19 < (byte)(bVar26 + 0xbf)) {
                                bVar22 = bVar26;
                              }
                              pbVar13[lVar15 + -2] = bVar22;
                              bVar18 = false;
                            } while ((lVar15 - 1U < uVar8) &&
                                    (pbVar1 = pbVar10 + lVar15, lVar15 = lVar15 + 1,
                                    pbVar1 < pbVar11));
                            bVar3 = true;
                            pbVar10 = pbVar11;
                            goto LAB_004d308d;
                          }
                        }
                        bVar18 = false;
                        goto LAB_004d30e3;
                      }
                      bVar18 = false;
                    }
                    if (bVar4) {
                      if (((bVar26 == 0x2d) || (bVar26 == 0x5f)) &&
                         ((uVar20 == 2 &&
                          (((byte)((*pbVar1 & 0xdf) + 0xbf) < 0x1a &&
                           ((byte)((pbVar10[2] & 0xdf) + 0xbf) < 0x1a)))))) {
LAB_004d2ff4:
                        if (uVar9 - 1 < uVar20) {
                          bVar4 = false;
                          goto LAB_004d308b;
                        }
                        if (uVar9 == 0) {
                          bVar4 = false;
                        }
                        else {
                          uVar20 = 1;
                          do {
                            bVar26 = pbVar10[uVar20];
                            bVar22 = bVar26 - 0x20;
                            if (0x19 < (byte)(bVar26 + 0x9f)) {
                              bVar22 = bVar26;
                            }
                            pcVar14[uVar20 - 1] = bVar22;
                            bVar4 = false;
                          } while ((uVar20 < uVar9) &&
                                  (lVar15 = uVar20 + 1, uVar20 = uVar20 + 1,
                                  pbVar10 + lVar15 < pbVar11));
                        }
                        goto LAB_004d30e3;
                      }
                      bVar4 = false;
                      if ((bVar26 == 0x2d) && (uVar20 == 3)) {
                        if ((((*pbVar1 & 0xfe) == 0x30) && ((pbVar10[2] & 0xfe) == 0x30)) &&
                           ((pbVar10[3] & 0xfe) == 0x30)) goto LAB_004d2ff4;
                        bVar4 = false;
                      }
                    }
                    if ((bool)~bVar5 || bVar26 != 0x5f) {
                      if (bVar5) {
                        bVar5 = false;
                      }
                      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_locale.cpp"
                                 ,0x310,"","Parser needs to be enhanced or input is not valid");
                    }
                    else {
                      if (uVar20 <= uVar23 - 1) {
                        if (uVar23 == 0) {
                          bVar5 = false;
                        }
                        else {
                          uVar20 = 1;
                          do {
                            pcVar24[uVar20 - 1] = pbVar10[uVar20];
                            bVar5 = false;
                            if (uVar23 <= uVar20) break;
                            lVar15 = uVar20 + 1;
                            uVar20 = uVar20 + 1;
                          } while (pbVar10 + lVar15 < pbVar11);
                        }
                        goto LAB_004d30e3;
                      }
                      bVar5 = false;
                    }
                  }
                }
LAB_004d308b:
                bVar3 = false;
                uVar16 = 0;
                pbVar10 = pbVar11;
              }
LAB_004d308d:
              if (!bVar3) {
                bVar26 = (byte)uVar16;
                break;
              }
              bVar26 = 1;
              if ((2 < uVar25) || (uVar25 = uVar25 + 1, pbVar27 <= pbVar10)) break;
            } while( true );
          }
          goto LAB_004d323d;
        }
      }
    }
    bVar26 = 0;
  }
LAB_004d323d:
  return (bool)(bVar26 & 1);
}

Assistant:

bool ON_Locale::ParseName(
  const char* locale_name,
  int locale_name_element_count,
  char* language_code,
  size_t language_code_capacity,
  char* extlang_code,
  size_t extlang_code_capacity,
  char* script_code,
  size_t script_code_capacity,
  char* region_code,
  size_t region_code_capacity,
  char* sortorder,
  size_t sortorder_capacity
  )
{
  bool rc = true;

  if ( false == ZeroCharBuffer(language_code, language_code_capacity, sizeof(language_code[0])) )
    rc = false;
  if ( false == ZeroCharBuffer(extlang_code, extlang_code_capacity, sizeof(extlang_code[0])) )
    rc = false;
  if ( false == ZeroCharBuffer(script_code,   script_code_capacity,   sizeof(script_code[0])) )
    rc = false;
  if ( false == ZeroCharBuffer(region_code,   region_code_capacity,   sizeof(region_code[0])) )
    rc = false;
  if ( false == ZeroCharBuffer(sortorder,     sortorder_capacity,     sizeof(sortorder[0])) )
    rc = false;

  if (!rc)
    return false;

  if ( nullptr == locale_name || 0 == locale_name[0] || 0 == locale_name_element_count )
    return true;

  if ( locale_name_element_count < 0 )
    locale_name_element_count = ON_String::Length(locale_name);

  if ( locale_name_element_count < 2 )
    return false;

  const char* locale_name_end = locale_name + locale_name_element_count;

  const char* s0 = locale_name;
  const char* s1 = s0;
  while( IsAlpha(*s1) )
    s1++;

  if ( s1-s0 < 2 )
    return false;

  for ( size_t i = 0; i < language_code_capacity && s0 < s1 ; i++)
    language_code[i] = ToLower(*s0++); // lower case for language code is a convention

  if ( 0 == language_code[0] || 0 == language_code[1] )
    return false;

  bool bScriptTest = true;
  bool bExtlangTest = true;
  bool bRegionTest = true;
  bool bSortOrderTest = true;

  for (int pass = 0; pass < 4 && s1 < locale_name_end; pass++)
  {
    char c0 = *s1;

    if (0 == c0)
      return true;

    if (false == IsHyphenOrUnderbar(c0))
      return false;

    s1++;
    s0 = s1;
    while (s1 < locale_name_end && IsAlphaOrDigit(*s1))
      s1++;

    if ( s1-s0 < 2 )
      return false;

    if (bExtlangTest)
    {
      bExtlangTest = false;
      if ( IsHyphen(c0)
        && 3 == s1 - s0
        && IsAlpha(s0[0])
        && IsAlpha(s0[1])
        && IsAlpha(s0[2])
        )
      {
        if ( extlang_code_capacity > 0 && extlang_code_capacity < (size_t)(s1-s0) )
          return false;
        if (extlang_code_capacity > 0)
        {
          for (size_t i = 0; i < extlang_code_capacity && s0 < s1; i++)
            extlang_code[i] = ToLower(*s0++); // lower case for extlang code is a convention
        }
        continue;
      }
    }

    if (bScriptTest)
    {
      bScriptTest = false;
      if ( IsHyphen(c0)
        && 4 == s1 - s0
        && IsAlpha(s0[0])
        && IsAlpha(s0[1])
        && IsAlpha(s0[2])
        && IsAlpha(s0[3])
        )
      {
        // ISO 15924 script code
        if ( script_code_capacity > 0 && script_code_capacity < (size_t)(s1-s0) )
          return false;
        if (script_code_capacity > 0)
        {
          // convention is for script codes is CAPITAL, small, small, small case
          script_code[0] = ToUpper(*s0++);
          for (size_t i = 1; i < script_code_capacity && s0 < s1; i++)
            script_code[i] = ToLower(*s0++);
        }
        continue;
      }
    }

    if (bRegionTest)
    {
      bRegionTest = false;
      // IsUnderbar(c0) is here to handle Apple OS X and iOS "locale id" names like "en_US" which use and underbar before region
      if (
        ( (IsHyphen(c0) || IsUnderbar(c0)) && 2 == s1 - s0 && IsAlpha(s0[0]) && IsAlpha(s0[1]) )  // ISO 3166 country/region identifier (2 alpha)
        || ( IsHyphen(c0) && 3 == s1 - s0 && IsDigit(s0[0]) && IsDigit(s0[1]) && IsDigit(s0[2]) ) // UN M.49 code (3 digits)
        )
      {
        if ( region_code_capacity > 0 && region_code_capacity <= (size_t)(s1-s0) )
          return false;
        for (size_t i = 0; i < region_code_capacity && s0 < s1; i++)
          region_code[i] = ToUpper(*s0++); // uppercase for regions is a convention
        continue;
      }
    }

    if (bSortOrderTest)
    {
      bSortOrderTest = false;
      if (IsUnderbar(c0))
      {
        // Windows sort order
        if (sortorder_capacity > 0 && sortorder_capacity <= (size_t)(s1 - s0))
          return false;
        for (size_t i = 0; i < sortorder_capacity && s0 < s1; i++)
          sortorder[i] = *s0++;
        continue;
      }
    }


    ON_ERROR("Parser needs to be enhanced or input is not valid");
    return false;
  }

  return true;

}